

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O0

void idx2::Reverse<signed_char*>(char *Beg,char *End)

{
  char cVar1;
  char *local_40;
  char *It2;
  char *It1;
  char *End_local;
  char *Beg_local;
  char T;
  
  local_40 = End + -1;
  for (It2 = Beg; It2 < local_40; It2 = It2 + 1) {
    cVar1 = *It2;
    *It2 = *local_40;
    *local_40 = cVar1;
    local_40 = local_40 + -1;
  }
  return;
}

Assistant:

void
Reverse(i Beg, i End)
{
  auto It1 = Beg;
  auto It2 = End - 1;
  while (It1 < It2)
  {
    Swap(It1, It2);
    ++It1;
    --It2;
  }
}